

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

short __thiscall
mp::internal::TextReader<fmt::Locale>::ReadInt<short>(TextReader<fmt::Locale> *this)

{
  bool bVar1;
  TextReader<fmt::Locale> *in_RDI;
  TextReader<fmt::Locale> *in_stack_00000008;
  CStringRef in_stack_00000010;
  short value;
  BasicCStringRef<char> local_18;
  uint6 in_stack_fffffffffffffff0;
  short sVar2;
  
  sVar2 = 0;
  bVar1 = DoReadOptionalInt<short>(in_RDI,(short *)(ulong)in_stack_fffffffffffffff0);
  if (!bVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"expected integer");
    ReportError<>(in_stack_00000008,in_stack_00000010);
  }
  return sVar2;
}

Assistant:

Int ReadInt() {
    Int value = 0;
    if (!DoReadOptionalInt(value))
      ReportError("expected integer");
    return value;
  }